

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player_mike_4.h
# Opt level: O2

void __thiscall PlayerMike_4::~PlayerMike_4(PlayerMike_4 *this)

{
  (this->super_Player)._vptr_Player = (_func_int **)&PTR__PlayerMike_4_0010cc08;
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&(this->m_predict).super__Vector_base<int,_std::allocator<int>_>);
  Player::~Player(&this->super_Player);
  return;
}

Assistant:

PlayerMike_4(const std::string& name) :
      Player(name),
      m_predict(27*9)
   {}